

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

Ref cashew::ValueBuilder::makeReturn(Ref value)

{
  bool bVar1;
  Value *pVVar2;
  Ref r;
  Ref local_30;
  Ref local_20;
  Ref local_18;
  Ref value_local;
  
  local_18.inst = value.inst;
  local_20 = makeRawArray(2);
  pVVar2 = Ref::operator->(&local_20);
  r = makeRawString((IString *)RETURN);
  pVVar2 = cashew::Value::push_back(pVVar2,r);
  bVar1 = Ref::operator!(&local_18);
  if (bVar1) {
    local_30 = makeNull();
  }
  else {
    local_30.inst = local_18.inst;
  }
  pVVar2 = cashew::Value::push_back(pVVar2,local_30);
  Ref::Ref(&value_local,pVVar2);
  return (Ref)value_local.inst;
}

Assistant:

static Ref makeReturn(Ref value) {
    return &makeRawArray(2)
              ->push_back(makeRawString(RETURN))
              .push_back(!!value ? value : makeNull());
  }